

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
set_verify_mode(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this,
               verify_mode v)

{
  char *in_RDI;
  error_code eVar1;
  error_code ec;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  error_code *in_stack_ffffffffffffffd8;
  verify_mode in_stack_ffffffffffffffe4;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_ffffffffffffffe8;
  
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  eVar1 = set_verify_mode(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                          in_stack_ffffffffffffffd8);
  asio::detail::throw_error((error_code *)CONCAT44(in_stack_ffffffffffffffd4,eVar1._M_value),in_RDI)
  ;
  return;
}

Assistant:

void set_verify_mode(verify_mode v)
  {
    asio::error_code ec;
    set_verify_mode(v, ec);
    asio::detail::throw_error(ec, "set_verify_mode");
  }